

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t jessilib::find<char8_t,char32_t,true>
                 (basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring)

{
  size_t sVar1;
  char8_t *pcVar2;
  char8_t *pcVar3;
  char8_t *pcVar4;
  jessilib *this;
  char8_t *pcVar5;
  jessilib *this_00;
  char8_t *pcVar6;
  decode_result dVar7;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  
  pcVar3 = (char8_t *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pcVar3 == (char8_t *)0x0) {
    pcVar5 = (char8_t *)0x0;
  }
  else {
    pcVar5 = (char8_t *)0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pcVar3 == (char8_t *)0x1) {
        in_string_00._M_str._0_4_ = *in_substring._M_str;
        in_string_00._M_str._4_4_ = 0;
        sVar1 = find<char8_t,true>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar1;
      }
      pcVar2 = (char8_t *)0x0;
      pcVar4 = pcVar3;
      for (; pcVar5 = (char8_t *)0xffffffffffffffff, this != (jessilib *)0x0;
          this = this + -(long)pcVar4) {
        pcVar6 = (char8_t *)0x0;
        pcVar5 = in_string_00._M_len;
        this_00 = this;
        do {
          in_string_01._M_str = pcVar4;
          in_string_01._M_len = (size_t)pcVar5;
          dVar7 = decode_codepoint_utf8<char8_t>(this_00,in_string_01);
          pcVar4 = (char8_t *)dVar7.units;
          if (pcVar4 == (char8_t *)0x0) {
            return (size_t)(char8_t *)0xffffffffffffffff;
          }
          if (dVar7.codepoint != in_substring._M_str[(long)pcVar6]) break;
          pcVar6 = pcVar6 + 1;
          if (pcVar3 == pcVar6) {
            return (size_t)pcVar2;
          }
          pcVar5 = pcVar5 + (long)pcVar4;
          this_00 = this_00 + -(long)pcVar4;
        } while (this_00 != (jessilib *)0x0);
        in_string_00._M_len = in_string_00._M_len + (long)pcVar4;
        pcVar2 = pcVar2 + (long)pcVar4;
      }
    }
  }
  return (size_t)pcVar5;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}